

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::ConsoleAssertionPrinter::printResultType(ConsoleAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  StringRef str;
  ColourGuard local_20;
  ConsoleAssertionPrinter *local_10;
  ConsoleAssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = StringRef::empty(&this->passOrFail);
  if (!bVar1) {
    poVar2 = this->stream;
    poVar3 = poVar2;
    ColourImpl::guardColour((ColourImpl *)&local_20,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_20);
    str.m_size = (size_type)poVar3;
    str.m_start = (char *)(this->passOrFail).m_size;
    poVar2 = Catch::operator<<((Catch *)poVar2,(ostream *)(this->passOrFail).m_start,str);
    std::operator<<(poVar2,":\n");
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
  }
  return;
}

Assistant:

void printResultType() const {
        if (!passOrFail.empty()) {
            stream << colourImpl->guardColour(colour) << passOrFail << ":\n";
        }
    }